

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pl_function.cc
# Opt level: O1

int g(char *data,size_t len,void *udata)

{
  size_t sVar1;
  ostream *poVar2;
  
  *(int *)udata = *udata + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"signed got ",0xb);
  if (data == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f7280);
  }
  else {
    sVar1 = strlen(data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,data,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return (uint)(*udata == 2) * 2;
}

Assistant:

int
g(char const* data, size_t len, void* udata)
{
    auto c = reinterpret_cast<Count*>(udata);
    ++c->count;
    std::cout << "signed got " << data << "(" << len << ")" << std::endl;
    if (c->count == 2) {
        return 2;
    }
    return 0;
}